

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frequency.c
# Opt level: O3

feed_db_status_t store_frequency_db(frequency_t *record,feed_db_t *db)

{
  int iVar1;
  char *pcVar2;
  long lVar3;
  char *pcVar4;
  sqlite3_stmt *stmt;
  char qr [110];
  sqlite3_stmt *local_a0;
  char local_98 [104];
  undefined4 local_30;
  undefined2 local_2c;
  
  pcVar2 = 
  "INSERT INTO frequencies (trip_id, start_time, end_time,headway_secs, exact_times) values (?1, ?2, ?3,?4, ?5);"
  ;
  pcVar4 = local_98;
  for (lVar3 = 0xd; lVar3 != 0; lVar3 = lVar3 + -1) {
    *(undefined8 *)pcVar4 = *(undefined8 *)pcVar2;
    pcVar2 = pcVar2 + 8;
    pcVar4 = pcVar4 + 8;
  }
  local_2c = 0x3b;
  local_30 = 0x29353f20;
  sqlite3_prepare_v2(db->conn,local_98,-1,&local_a0,(char **)0x0);
  sqlite3_bind_text(local_a0,1,record->trip_id,-1,(_func_void_void_ptr *)0x0);
  sqlite3_bind_text(local_a0,2,record->start_time,-1,(_func_void_void_ptr *)0x0);
  sqlite3_bind_text(local_a0,3,record->end_time,-1,(_func_void_void_ptr *)0x0);
  sqlite3_bind_int(local_a0,4,record->headway_secs);
  sqlite3_bind_int(local_a0,5,record->exact_times);
  iVar1 = sqlite3_step(local_a0);
  db->rc = iVar1;
  if (iVar1 != 0x65) {
    pcVar2 = sqlite3_errmsg(db->conn);
    pcVar2 = strdup(pcVar2);
    db->error_msg = pcVar2;
  }
  sqlite3_finalize(local_a0);
  return (uint)(iVar1 == 0x65);
}

Assistant:

feed_db_status_t store_frequency_db(frequency_t *record, feed_db_t *db) {
    sqlite3_stmt *stmt;
    char qr[] = "INSERT INTO frequencies ("
                    "trip_id, start_time, end_time,"
                    "headway_secs, exact_times"
                ") values ("
                    "?1, ?2, ?3,"
                    "?4, ?5"
                ");";

    sqlite3_prepare_v2(db->conn, qr, -1, &stmt, NULL);

    sqlite3_bind_text(stmt, 1, record->trip_id, -1, SQLITE_STATIC);
    sqlite3_bind_text(stmt, 2, record->start_time, -1, SQLITE_STATIC);
    sqlite3_bind_text(stmt, 3, record->end_time, -1, SQLITE_STATIC);
    sqlite3_bind_int(stmt, 4, record->headway_secs);
    sqlite3_bind_int(stmt, 5, (int)record->exact_times);

    db->rc = sqlite3_step(stmt);
    if (db->rc != SQLITE_DONE) {
        db->error_msg = strdup(sqlite3_errmsg(db->conn));
        sqlite3_finalize(stmt);
        return FEED_DB_ERROR;
    }

    sqlite3_finalize(stmt);
    return FEED_DB_SUCCESS;
}